

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  byte bVar1;
  pointer paVar2;
  void *__ptr;
  uint __val;
  _Alloc_hider _Var3;
  _typeobject *p_Var4;
  uint uVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  long *plVar10;
  type_info *ptVar11;
  handle *phVar12;
  undefined8 *puVar13;
  function_record *pfVar14;
  function_record *pfVar15;
  PyMethodDef *pPVar16;
  object *poVar17;
  PyObject *pPVar18;
  type_info *ptVar19;
  PyObject *pPVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  ulong *puVar22;
  ulong uVar23;
  PyTypeObject *pPVar24;
  size_type *psVar25;
  object *object;
  function_record *pfVar26;
  ulong uVar27;
  char cVar28;
  undefined8 uVar29;
  pointer paVar30;
  long lVar31;
  uint __len;
  uint uVar32;
  _typeobject *p_Var33;
  bool bVar34;
  string signatures;
  capsule rec_capsule_1;
  object scope_module;
  string signature;
  undefined1 local_1c8 [16];
  char *local_1b8;
  object oStack_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  function_record *local_148;
  allocator<char> local_139;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  PyBufferProcs *local_118;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_110;
  type_info **local_108;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_100;
  undefined1 local_e0 [24];
  object local_c8;
  str local_c0;
  _typeobject *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pcVar9 = "";
  if (rec->name != (char *)0x0) {
    pcVar9 = rec->name;
  }
  local_118 = (PyBufferProcs *)this;
  local_108 = types;
  local_b8 = (_typeobject *)args;
  pcVar9 = strdup(pcVar9);
  rec->name = pcVar9;
  if (rec->doc != (char *)0x0) {
    pcVar9 = strdup(rec->doc);
    rec->doc = pcVar9;
  }
  paVar30 = (rec->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_148 = rec;
  if (paVar30 != paVar2) {
    do {
      if (paVar30->name != (char *)0x0) {
        pcVar9 = strdup(paVar30->name);
        paVar30->name = pcVar9;
      }
      if (paVar30->descr == (char *)0x0) {
        if ((paVar30->value).m_ptr != (PyObject *)0x0) {
          local_1c8._8_8_ = (paVar30->value).m_ptr;
          local_1b8 = "__repr__";
          oStack_1b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
          detail::
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
          operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                      *)&local_1a8);
          cast<std::__cxx11::string>(&local_100,(pybind11 *)&local_1a8,object);
          _Var3._M_p = local_100._M_dataplus._M_p;
          pcVar9 = strdup(local_100._M_dataplus._M_p);
          paVar30->descr = pcVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var3._M_p != &local_100.field_2) {
            operator_delete(_Var3._M_p,
                            CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                     local_100.field_2._M_local_buf[0]) + 1);
          }
          pybind11::object::~object((object *)&local_1a8);
          pybind11::object::~object(&oStack_1b0);
          rec = local_148;
        }
      }
      else {
        pcVar9 = strdup(paVar30->descr);
        paVar30->descr = pcVar9;
      }
      paVar30 = paVar30 + 1;
    } while (paVar30 != paVar2);
  }
  pcVar9 = rec->name;
  iVar7 = strcmp(pcVar9,"__init__");
  if (iVar7 == 0) {
    bVar34 = true;
  }
  else {
    iVar7 = strcmp(pcVar9,"__setstate__");
    bVar34 = iVar7 == 0;
  }
  bVar1 = rec->field_0x59;
  rec->field_0x59 = bVar1 & 0xfe | bVar34;
  if (((bVar1 & 2) == 0 & bVar34) == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,(char *)(rec->scope).m_ptr[1].ob_type,
               (allocator<char> *)local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,rec->name,(allocator<char> *)&local_1a8);
    uVar29 = _PyExc_FutureWarning;
    std::operator+(&local_168,"pybind11-bound class \'",&local_100);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_168);
    pPVar18 = (PyObject *)(plVar10 + 2);
    if ((PyObject *)*plVar10 == pPVar18) {
      local_128._0_8_ = pPVar18->ob_refcnt;
      local_128._8_8_ = plVar10[3];
      local_138._0_8_ = (PyObject *)local_128;
    }
    else {
      local_128._0_8_ = pPVar18->ob_refcnt;
      local_138._0_8_ = (PyObject *)*plVar10;
    }
    local_138._8_8_ = plVar10[1];
    *plVar10 = (long)pPVar18;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append(local_138,local_1c8._0_8_);
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar21) {
      local_188.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_188.field_2._8_8_ = plVar10[3];
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    }
    else {
      local_188.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_188._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_188._M_string_length = plVar10[1];
    *plVar10 = (long)paVar21;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_188);
    puVar22 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar22) {
      local_1a8.field_2._M_allocated_capacity = *puVar22;
      local_1a8.field_2._8_8_ = plVar10[3];
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *puVar22;
      local_1a8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_1a8._M_string_length = plVar10[1];
    *plVar10 = (long)puVar22;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    PyErr_WarnEx(uVar29,local_1a8._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    rec = local_148;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((PyObject *)local_138._0_8_ != (PyObject *)local_128) {
      operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)&local_1b8) {
      operator_delete((void *)local_1c8._0_8_,(ulong)((long)local_1b8 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                               local_100.field_2._M_local_buf[0]) + 1);
    }
  }
  local_110 = &rec->args;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  p_Var33 = (_typeobject *)0x0;
  lVar31 = 0;
  do {
    p_Var4 = local_b8;
    bVar1 = *text;
    if (bVar1 < 0x7b) {
      if (bVar1 == 0x25) {
        pPVar24 = (PyTypeObject *)local_108[lVar31];
        if (pPVar24 == (PyTypeObject *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_1c8._0_8_ = pPVar24;
        ptVar11 = detail::get_type_info((type_index *)local_1c8,false);
        rec = local_148;
        lVar31 = lVar31 + 1;
        if (ptVar11 == (type_info *)0x0) {
          if ((p_Var33 == (_typeobject *)0x0 & (byte)local_148->field_0x59 >> 1) != 1) {
            pPVar24 = (pPVar24->ob_base).ob_base.ob_type;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1c8,
                       (char *)((long)&(pPVar24->ob_base).ob_base.ob_refcnt +
                               (ulong)((char)(pPVar24->ob_base).ob_base.ob_refcnt == '*')),
                       (allocator<char> *)&local_1a8);
            detail::clean_type_id((string *)local_1c8);
            rec = local_148;
            std::__cxx11::string::_M_append((char *)&local_100,local_1c8._0_8_);
            if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)&local_1b8) {
              operator_delete((void *)local_1c8._0_8_,(ulong)((long)local_1b8 + 1));
            }
            goto LAB_001bc255;
          }
          local_138._8_8_ = (local_148->scope).m_ptr;
          local_128._0_8_ = "__module__";
          local_128._8_8_ = (PyObject *)0x0;
          phVar12 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_138
                               )->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_188,phVar12);
          puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar22 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar22) {
            local_1a8.field_2._M_allocated_capacity = *puVar22;
            local_1a8.field_2._8_8_ = puVar13[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar22;
            local_1a8._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_1a8._M_string_length = puVar13[1];
          *puVar13 = puVar22;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          local_e0._8_8_ = (rec->scope).m_ptr;
          local_e0._16_8_ = "__qualname__";
          local_c8.super_handle.m_ptr = (handle)(PyObject *)0x0;
          phVar12 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_e0)
                     ->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_168,phVar12);
          uVar29 = (reprfunc)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            uVar29 = local_1a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar29 < (reprfunc)(local_168._M_string_length + local_1a8._M_string_length)) {
            uVar29 = (reprfunc)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              uVar29 = local_168.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar29 < (reprfunc)(local_168._M_string_length + local_1a8._M_string_length))
            goto LAB_001bc062;
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_168,0,(char *)0x0,
                                         (ulong)local_1a8._M_dataplus._M_p);
          }
          else {
LAB_001bc062:
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_1a8,(ulong)local_168._M_dataplus._M_p);
          }
          local_1c8._0_8_ = &local_1b8;
          pPVar24 = (PyTypeObject *)(plVar10 + 2);
          if ((PyTypeObject *)*plVar10 == pPVar24) {
            local_1b8 = (char *)(pPVar24->ob_base).ob_base.ob_refcnt;
            oStack_1b0.super_handle.m_ptr = (handle)plVar10[3];
          }
          else {
            local_1b8 = (char *)(pPVar24->ob_base).ob_base.ob_refcnt;
            local_1c8._0_8_ = (PyTypeObject *)*plVar10;
          }
          local_1c8._8_8_ = plVar10[1];
          *plVar10 = (long)pPVar24;
          plVar10[1] = 0;
          *(undefined1 *)&(pPVar24->ob_base).ob_base.ob_refcnt = 0;
          std::__cxx11::string::_M_append((char *)&local_100,local_1c8._0_8_);
        }
        else {
          pPVar24 = ptVar11->type;
          local_128._0_8_ = "__module__";
          local_128._8_8_ = (PyObject *)0x0;
          local_138._8_8_ = pPVar24;
          phVar12 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_138
                               )->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_188,phVar12);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar22 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar22) {
            local_1a8.field_2._M_allocated_capacity = *puVar22;
            local_1a8.field_2._8_8_ = plVar10[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar22;
            local_1a8._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_1a8._M_string_length = plVar10[1];
          *plVar10 = (long)puVar22;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          local_e0._16_8_ = "__qualname__";
          local_c8.super_handle.m_ptr = (handle)(PyObject *)0x0;
          local_e0._8_8_ = pPVar24;
          phVar12 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_e0)
                     ->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_168,phVar12);
          rec = local_148;
          uVar29 = (reprfunc)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            uVar29 = local_1a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar29 < (reprfunc)(local_168._M_string_length + local_1a8._M_string_length)) {
            uVar29 = (reprfunc)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              uVar29 = local_168.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar29 < (reprfunc)(local_168._M_string_length + local_1a8._M_string_length))
            goto LAB_001bbed2;
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_168,0,(char *)0x0,
                                         (ulong)local_1a8._M_dataplus._M_p);
          }
          else {
LAB_001bbed2:
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_1a8,(ulong)local_168._M_dataplus._M_p);
          }
          local_1c8._0_8_ = &local_1b8;
          pPVar24 = (PyTypeObject *)(plVar10 + 2);
          if ((PyTypeObject *)*plVar10 == pPVar24) {
            local_1b8 = (char *)(pPVar24->ob_base).ob_base.ob_refcnt;
            oStack_1b0.super_handle.m_ptr = (handle)plVar10[3];
          }
          else {
            local_1b8 = (char *)(pPVar24->ob_base).ob_base.ob_refcnt;
            local_1c8._0_8_ = (PyTypeObject *)*plVar10;
          }
          local_1c8._8_8_ = plVar10[1];
          *plVar10 = (long)pPVar24;
          plVar10[1] = 0;
          *(undefined1 *)&(pPVar24->ob_base).ob_base.ob_refcnt = 0;
          std::__cxx11::string::_M_append((char *)&local_100,local_1c8._0_8_);
        }
        if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)&local_1b8) {
          operator_delete((void *)local_1c8._0_8_,(ulong)((long)local_1b8 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        pybind11::object::~object(&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        pybind11::object::~object((object *)(local_128 + 8));
      }
      else {
        if (bVar1 == 0) break;
LAB_001bbd77:
        std::__cxx11::string::push_back('\0');
      }
    }
    else if (bVar1 == 0x7b) {
      if (((byte *)text)[1] != 0x2a) {
        paVar30 = (rec->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((p_Var33 < (_typeobject *)
                        ((long)(rec->args).
                               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30 >> 5)) &&
            (paVar30[(long)p_Var33].name != (char *)0x0)) ||
           ((p_Var33 == (_typeobject *)0x0 && ((rec->field_0x59 & 0x40) != 0)))) {
          std::__cxx11::string::append((char *)&local_100);
        }
        else {
          uVar27 = (long)p_Var33 - (ulong)(((byte)rec->field_0x59 >> 6 & 1) != 0);
          cVar28 = '\x01';
          if (9 < uVar27) {
            uVar23 = uVar27;
            cVar6 = '\x04';
            do {
              cVar28 = cVar6;
              if (uVar23 < 100) {
                cVar28 = cVar28 + -2;
                goto LAB_001bc16d;
              }
              if (uVar23 < 1000) {
                cVar28 = cVar28 + -1;
                goto LAB_001bc16d;
              }
              if (uVar23 < 10000) goto LAB_001bc16d;
              bVar34 = 99999 < uVar23;
              uVar23 = uVar23 / 10000;
              cVar6 = cVar28 + '\x04';
            } while (bVar34);
            cVar28 = cVar28 + '\x01';
          }
LAB_001bc16d:
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_1a8,cVar28);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_1a8._M_dataplus._M_p,(uint)local_1a8._M_string_length,uVar27);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x2e623f);
          rec = local_148;
          local_1c8._0_8_ = &local_1b8;
          pPVar24 = (PyTypeObject *)(plVar10 + 2);
          if ((PyTypeObject *)*plVar10 == pPVar24) {
            local_1b8 = (char *)(pPVar24->ob_base).ob_base.ob_refcnt;
            oStack_1b0.super_handle.m_ptr = (handle)plVar10[3];
          }
          else {
            local_1b8 = (char *)(pPVar24->ob_base).ob_base.ob_refcnt;
            local_1c8._0_8_ = (PyTypeObject *)*plVar10;
          }
          local_1c8._8_8_ = plVar10[1];
          *plVar10 = (long)pPVar24;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_100,local_1c8._0_8_);
          if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)&local_1b8) {
            operator_delete((void *)local_1c8._0_8_,(ulong)((long)local_1b8 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)&local_100);
      }
    }
    else {
      if (bVar1 != 0x7d) goto LAB_001bbd77;
      paVar30 = (rec->args).
                super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((p_Var33 < (_typeobject *)
                     ((long)(rec->args).
                            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30 >> 5)) &&
         (paVar30[(long)p_Var33].descr != (char *)0x0)) {
        std::__cxx11::string::append((char *)&local_100);
        std::__cxx11::string::append((char *)&local_100);
      }
      p_Var33 = (_typeobject *)((long)&(p_Var33->ob_base).ob_base.ob_refcnt + 1);
    }
LAB_001bc255:
    text = (char *)((byte *)text + 1);
  } while( true );
  if ((p_Var33 != local_b8) || (local_108[lVar31] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar9 = strdup(local_100._M_dataplus._M_p);
  rec->signature = pcVar9;
  if ((rec->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (rec->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it(local_110);
  }
  rec->nargs = (uint16_t)p_Var4;
  pPVar18 = (rec->sibling).m_ptr;
  if ((pPVar18 != (PyObject *)0x0) && (pPVar18->ob_type == (PyTypeObject *)&PyInstanceMethod_Type))
  {
    (rec->sibling).m_ptr = (PyObject *)pPVar18[1].ob_refcnt;
  }
  pPVar18 = (rec->sibling).m_ptr;
  if (pPVar18 == (PyObject *)0x0) {
LAB_001bc34d:
    pfVar26 = (function_record *)0x0;
  }
  else {
    pPVar24 = pPVar18->ob_type;
    if ((pPVar24 != (PyTypeObject *)&PyCFunction_Type) &&
       (iVar7 = PyType_IsSubtype(pPVar24,&PyCFunction_Type), iVar7 == 0)) {
      if (((rec->sibling).m_ptr != (PyObject *)&_Py_NoneStruct) && (*rec->name != '_')) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,rec->name,(allocator<char> *)local_138);
        std::operator+(&local_1a8,"Cannot overload existing non-function object \"",&local_188);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a8);
        local_1c8._0_8_ = *plVar10;
        ptVar19 = (type_info *)(plVar10 + 2);
        if ((type_info *)local_1c8._0_8_ == ptVar19) {
          local_1b8 = *(char **)ptVar19;
          oStack_1b0.super_handle.m_ptr = (handle)plVar10[3];
          local_1c8._0_8_ = (type_info *)&local_1b8;
        }
        else {
          local_1b8 = *(char **)ptVar19;
        }
        local_1c8._8_8_ = plVar10[1];
        *plVar10 = (long)ptVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        pybind11_fail((string *)local_1c8);
      }
      goto LAB_001bc34d;
    }
    pPVar18 = (rec->sibling).m_ptr;
    if ((*(byte *)(pPVar18[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_1c8._0_8_ = pPVar18[1].ob_type;
    }
    else {
      local_1c8._0_8_ = (PyTypeObject *)0x0;
    }
    if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)0x0) {
      (((PyTypeObject *)local_1c8._0_8_)->ob_base).ob_base.ob_refcnt =
           (((PyTypeObject *)local_1c8._0_8_)->ob_base).ob_base.ob_refcnt + 1;
    }
    pfVar14 = capsule::operator_cast_to_function_record_((capsule *)local_1c8);
    pfVar26 = (function_record *)0x0;
    if ((pfVar14->scope).m_ptr == (rec->scope).m_ptr) {
      pfVar26 = pfVar14;
    }
    pybind11::object::~object((object *)local_1c8);
  }
  if (pfVar26 != (function_record *)0x0) {
    pPVar18 = (rec->sibling).m_ptr;
    (((function *)&local_118->bf_getbuffer)->super_object).super_handle.m_ptr = pPVar18;
    if (pPVar18 != (PyObject *)0x0) {
      pPVar18->ob_refcnt = pPVar18->ob_refcnt + 1;
    }
    bVar1 = rec->field_0x59;
    pfVar14 = pfVar26;
    if (((pfVar26->field_0x59 ^ bVar1) & 0x40) != 0) {
      pcVar9 = "instance";
      if ((bVar1 & 0x40) == 0) {
        pcVar9 = "static";
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,pcVar9,pcVar9 + (ulong)((bVar1 & 0x40) >> 6) * 2 + 6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                     ,&local_b0);
      plVar10 = (long *)std::__cxx11::string::append(local_e0);
      local_168._M_dataplus._M_p = (pointer)*plVar10;
      psVar25 = (size_type *)(plVar10 + 2);
      if ((size_type *)local_168._M_dataplus._M_p == psVar25) {
        local_168.field_2._M_allocated_capacity = *psVar25;
        local_168.field_2._8_8_ = plVar10[3];
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar25;
      }
      local_168._M_string_length = plVar10[1];
      *plVar10 = (long)psVar25;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_50.obj.m_ptr = (local_148->scope).m_ptr;
      local_50.key = "__name__";
      local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      str::str<pybind11::detail::accessor_policies::str_attr>(&local_c0,&local_50);
      str::operator_cast_to_string(&local_70,&local_c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     &local_168,&local_70);
      plVar10 = (long *)std::__cxx11::string::append(local_138);
      local_188._M_dataplus._M_p = (pointer)*plVar10;
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == paVar21) {
        local_188.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_188.field_2._8_8_ = plVar10[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
      }
      local_188._M_string_length = plVar10[1];
      *plVar10 = (long)paVar21;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,local_148->name,&local_139);
      std::operator+(&local_1a8,&local_188,&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     &local_1a8,&local_100);
      pybind11_fail((string *)local_1c8);
    }
    do {
      pfVar15 = pfVar14;
      pfVar14 = pfVar15->next;
    } while (pfVar14 != (function_record *)0x0);
    pfVar15->next = rec;
    pfVar14 = pfVar26;
    goto LAB_001bc4df;
  }
  pPVar16 = (PyMethodDef *)operator_new(0x20);
  *(undefined8 *)&pPVar16->ml_flags = 0;
  pPVar16->ml_doc = (char *)0x0;
  pPVar16->ml_name = (char *)0x0;
  pPVar16->ml_meth = (PyCFunction)0x0;
  rec->def = pPVar16;
  *(undefined8 *)&pPVar16->ml_flags = 0;
  pPVar16->ml_doc = (char *)0x0;
  pPVar16->ml_name = (char *)0x0;
  pPVar16->ml_meth = (PyCFunction)0x0;
  pPVar16->ml_name = rec->name;
  pPVar16->ml_meth = dispatcher;
  pPVar16->ml_flags = 3;
  capsule::capsule((capsule *)&local_1a8,rec,initialize_generic::anon_class_1_0_00000001::__invoke);
  local_188._M_dataplus._M_p = (pointer)0x0;
  pPVar18 = (rec->scope).m_ptr;
  if (pPVar18 != (PyObject *)0x0) {
    iVar7 = PyObject_HasAttrString(pPVar18,"__module__");
    if (iVar7 == 1) {
      local_1c8._8_8_ = (rec->scope).m_ptr;
      local_1b8 = "__module__";
      oStack_1b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar17 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1c8);
    }
    else {
      iVar7 = PyObject_HasAttrString((rec->scope).m_ptr,"__name__");
      if (iVar7 != 1) goto LAB_001bc49f;
      local_1c8._8_8_ = (rec->scope).m_ptr;
      local_1b8 = "__name__";
      oStack_1b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar17 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1c8);
    }
    local_138._0_8_ = (poVar17->super_handle).m_ptr;
    if ((PyObject *)local_138._0_8_ != (PyObject *)0x0) {
      ((PyObject *)local_138._0_8_)->ob_refcnt = ((PyObject *)local_138._0_8_)->ob_refcnt + 1;
    }
    pybind11::object::operator=((object *)&local_188,(object *)local_138);
    pybind11::object::~object((object *)local_138);
    pybind11::object::~object(&oStack_1b0);
  }
LAB_001bc49f:
  pPVar18 = (PyObject *)
            PyCMethod_New(rec->def,local_1a8._M_dataplus._M_p,local_188._M_dataplus._M_p,0);
  (((function *)&local_118->bf_getbuffer)->super_object).super_handle.m_ptr = pPVar18;
  if (pPVar18 == (PyObject *)0x0) {
    pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
  }
  pybind11::object::~object((object *)&local_188);
  pybind11::object::~object((object *)&local_1a8);
  pfVar14 = rec;
LAB_001bc4df:
  ptVar19 = (type_info *)&local_1b8;
  local_1c8._8_8_ = (PyObject *)0x0;
  local_1b8 = (char *)((ulong)local_1b8 & 0xffffffffffffff00);
  local_1c8._0_8_ = ptVar19;
  if ((pfVar26 != (function_record *)0x0) && (DAT_0038cd69 == '\x01')) {
    std::__cxx11::string::append(local_1c8);
    std::__cxx11::string::append(local_1c8);
    ptVar19 = (type_info *)std::__cxx11::string::append(local_1c8);
  }
  iVar7 = 0;
  local_110 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               *)CONCAT44(local_110._4_4_,(int)CONCAT71((int7)((ulong)ptVar19 >> 8),1));
  do {
    if (DAT_0038cd69 == '\x01') {
      if (0 < iVar7) {
        std::__cxx11::string::append(local_1c8);
      }
      if (pfVar26 != (function_record *)0x0) {
        uVar32 = iVar7 + 1;
        local_108 = (type_info **)CONCAT44(local_108._4_4_,uVar32);
        __val = -uVar32;
        if (0 < (int)uVar32) {
          __val = uVar32;
        }
        __len = 1;
        if (9 < __val) {
          uVar27 = (ulong)__val;
          uVar5 = 4;
          do {
            __len = uVar5;
            uVar8 = (uint)uVar27;
            if (uVar8 < 100) {
              __len = __len - 2;
              goto LAB_001bc5cf;
            }
            if (uVar8 < 1000) {
              __len = __len - 1;
              goto LAB_001bc5cf;
            }
            if (uVar8 < 10000) goto LAB_001bc5cf;
            uVar27 = uVar27 / 10000;
            uVar5 = __len + 4;
          } while (99999 < uVar8);
          __len = __len + 1;
        }
LAB_001bc5cf:
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_188,(char)__len - (char)((int)uVar32 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_188._M_dataplus._M_p + (uVar32 >> 0x1f),__len,__val);
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
        rec = local_148;
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        puVar22 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_1a8.field_2._M_allocated_capacity = *puVar22;
          local_1a8.field_2._8_8_ = puVar13[3];
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *puVar22;
          local_1a8._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_1a8._M_string_length = puVar13[1];
        *puVar13 = puVar22;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::_M_append(local_1c8,(ulong)local_1a8._M_dataplus._M_p);
        iVar7 = (int)local_108;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append(local_1c8);
      std::__cxx11::string::append(local_1c8);
      std::__cxx11::string::append(local_1c8);
    }
    if (((pfVar14->doc != (char *)0x0) && (*pfVar14->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if (DAT_0038cd69 == '\0') {
        if (((ulong)local_110 & 1) == 0) {
          std::__cxx11::string::append(local_1c8);
        }
        else {
          local_110 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       *)((ulong)local_110 & 0xffffffff00000000);
        }
      }
      if (DAT_0038cd69 == '\x01') {
        std::__cxx11::string::append(local_1c8);
      }
      std::__cxx11::string::append(local_1c8);
      if (DAT_0038cd69 == '\x01') {
        std::__cxx11::string::append(local_1c8);
      }
    }
    pfVar14 = pfVar14->next;
    if (pfVar14 == (function_record *)0x0) {
      pPVar18 = (((function *)&local_118->bf_getbuffer)->super_object).super_handle.m_ptr;
      __ptr = *(void **)(pPVar18[1].ob_refcnt + 0x18);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      pcVar9 = strdup((char *)local_1c8._0_8_);
      *(char **)(pPVar18[1].ob_refcnt + 0x18) = pcVar9;
      if ((rec->field_0x59 & 0x40) != 0) {
        pPVar20 = (PyObject *)
                  PyInstanceMethod_New
                            ((((function *)&local_118->bf_getbuffer)->super_object).super_handle.
                             m_ptr);
        (((function *)&local_118->bf_getbuffer)->super_object).super_handle.m_ptr = pPVar20;
        if (pPVar20 == (PyObject *)0x0) {
          pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
        }
        pPVar18->ob_refcnt = pPVar18->ob_refcnt + -1;
        if (pPVar18->ob_refcnt == 0) {
          _Py_Dealloc(pPVar18);
        }
      }
      if ((type_info *)local_1c8._0_8_ != (type_info *)&local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(long)local_1b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                 local_100.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = std::string(((PyTypeObject *) rec->scope.ptr())->tp_name);
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;

                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }